

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_robust_atomic_counter_op(Impl *this,SPIRVModule *module)

{
  initializer_list<unsigned_int> __l;
  Id IVar1;
  Function *pFVar2;
  Block *pBVar3;
  pointer pIVar4;
  pointer pIVar5;
  size_t sVar6;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_158;
  Id local_14c;
  undefined4 local_148;
  Id return_value;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_140;
  __single_object phi_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_130;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_128;
  undefined4 local_120;
  Id local_11c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_118;
  __single_object add_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_108;
  __single_object atomic_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_f8;
  __single_object bitcast_op;
  Id uint_ptr_type;
  Id loaded_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_e0;
  Id local_d4;
  undefined4 local_d0;
  Id cond_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_c8;
  __single_object not_zero;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_b8;
  __single_object compare;
  Op local_a8;
  Id null_bda;
  Id bvec2_type;
  Id bool_type;
  Block *merge_block;
  Block *body_block;
  allocator_type local_75;
  Id local_74;
  Id local_70;
  Id local_6c;
  iterator local_68;
  undefined8 local_60;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_58;
  Function *local_40;
  Function *func;
  Id bda_type;
  Id uint_type;
  Block *entry;
  Block *current_build_point;
  SPIRVModule *module_local;
  Impl *this_local;
  
  if (this->robust_atomic_counter_call_id == 0) {
    current_build_point = (Block *)module;
    module_local = (SPIRVModule *)this;
    entry = spv::Builder::getBuildPoint(&this->builder);
    _bda_type = (Block *)0x0;
    func._4_4_ = spv::Builder::makeUintType(&this->builder,0x20);
    local_74 = spv::Builder::makeVectorType(&this->builder,func._4_4_,2);
    IVar1 = func._4_4_;
    local_70 = func._4_4_;
    local_6c = func._4_4_;
    local_68 = &local_74;
    local_60 = 3;
    __l._M_len = 3;
    __l._M_array = local_68;
    func._0_4_ = local_74;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_58,__l,&local_75);
    memset(&body_block,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)&body_block);
    sVar6 = 0x7fffffff;
    pFVar2 = spv::Builder::makeFunctionEntry
                       (&this->builder,DecorationMax,IVar1,"RobustPhysicalAtomicCounter",&local_58,
                        (Vector<dxil_spv::Vector<Decoration>_> *)&body_block,(Block **)&bda_type);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)&body_block);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_58);
    local_40 = pFVar2;
    pBVar3 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    sVar6 = (size_t)IVar1;
    spv::Block::Block(pBVar3,IVar1,local_40);
    merge_block = pBVar3;
    pBVar3 = (Block *)spv::Block::operator_new((Block *)0x78,sVar6);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block(pBVar3,IVar1,local_40);
    _bvec2_type = pBVar3;
    null_bda = spv::Builder::makeBoolType(&this->builder);
    local_a8 = spv::Builder::makeVectorType(&this->builder,null_bda,2);
    compare._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::makeNullConstant(&this->builder,(Id)func);
    not_zero._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    not_zero._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xab;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_b8,
               (uint *)((long)&not_zero._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               &local_a8);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_b8);
    IVar1 = spv::Function::getParamId(local_40,0);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_b8);
    spv::Instruction::addIdOperand
              (pIVar4,compare._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    cond_id = spv::Builder::getUniqueId(&this->builder);
    local_d0 = 0x9a;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_c8,&cond_id,&null_bda);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_c8);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_b8);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_c8);
    local_d4 = spv::Instruction::getResultId(pIVar4);
    pBVar3 = _bda_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_e0,&local_b8);
    add_instruction(this,pBVar3,&local_e0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_e0);
    pBVar3 = _bda_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               &uint_ptr_type,&local_c8);
    add_instruction(this,pBVar3,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &uint_ptr_type);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
               &uint_ptr_type);
    spv::Builder::setBuildPoint(&this->builder,_bda_type);
    spv::Builder::createSelectionMerge(&this->builder,_bvec2_type,0);
    spv::Builder::createConditionalBranch(&this->builder,local_d4,merge_block,_bvec2_type);
    spv::Builder::setBuildPoint(&this->builder,merge_block);
    bitcast_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ =
         spv::Builder::makePointer(&this->builder,StorageClassPhysicalStorageBuffer,func._4_4_);
    atomic_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    atomic_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x7c;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_f8,
               (uint *)((long)&atomic_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               (Op *)&bitcast_op);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_f8);
    IVar1 = spv::Function::getParamId(local_40,0);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    add_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Builder::getUniqueId(&this->builder);
    add_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0xea;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_108,
               (uint *)((long)&add_op._M_t.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
               (Op *)((long)&func + 4));
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_108);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_f8);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_108);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,1,false);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_108);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_108);
    IVar1 = spv::Function::getParamId(local_40,1);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    local_11c = spv::Builder::getUniqueId(&this->builder);
    local_120 = 0x80;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_118,&local_11c,(Op *)((long)&func + 4));
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_108);
    IVar1 = spv::Instruction::getResultId(pIVar5);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    IVar1 = spv::Function::getParamId(local_40,2);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    bitcast_op._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Instruction::getResultId(pIVar4);
    pBVar3 = merge_block;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_128,&local_f8);
    add_instruction(this,pBVar3,&local_128);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_128);
    pBVar3 = merge_block;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_130,&local_108);
    add_instruction(this,pBVar3,&local_130);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_130);
    pBVar3 = merge_block;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&phi_op,&local_118);
    add_instruction(this,pBVar3,&phi_op);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&phi_op);
    spv::Builder::createBranch(&this->builder,_bvec2_type);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_118);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_108);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_f8);
    spv::Builder::setBuildPoint(&this->builder,_bvec2_type);
    return_value = spv::Builder::getUniqueId(&this->builder);
    local_148 = 0xf5;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_140,&return_value,(Op *)((long)&func + 4));
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_140);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,0,false);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_140);
    IVar1 = spv::Block::getId(_bda_type);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_140);
    spv::Instruction::addIdOperand
              (pIVar4,bitcast_op._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_140);
    IVar1 = spv::Block::getId(merge_block);
    spv::Instruction::addIdOperand(pIVar4,IVar1);
    pIVar4 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_140);
    local_14c = spv::Instruction::getResultId(pIVar4);
    pBVar3 = _bvec2_type;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_158,&local_140);
    add_instruction(this,pBVar3,&local_158);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_158);
    spv::Builder::makeReturn(&this->builder,false,local_14c);
    spv::Builder::setBuildPoint(&this->builder,entry);
    IVar1 = spv::Function::getId(local_40);
    this->robust_atomic_counter_call_id = IVar1;
    this_local._4_4_ = spv::Function::getId(local_40);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_140);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_c8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_b8);
  }
  else {
    this_local._4_4_ = this->robust_atomic_counter_call_id;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id SPIRVModule::Impl::build_robust_atomic_counter_op(SPIRVModule &module)
{
	if (robust_atomic_counter_call_id)
		return robust_atomic_counter_call_id;

	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id bda_type = builder.makeVectorType(uint_type, 2);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uint_type,
	                                       "RobustPhysicalAtomicCounter",
	                                       { bda_type, uint_type, uint_type }, {}, &entry);

	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);

	spv::Id bool_type = builder.makeBoolType();
	spv::Id bvec2_type = builder.makeVectorType(bool_type, 2);

	spv::Id null_bda = builder.makeNullConstant(bda_type);
	auto compare = std::make_unique<spv::Instruction>(builder.getUniqueId(), bvec2_type, spv::OpINotEqual);
	compare->addIdOperand(func->getParamId(0));
	compare->addIdOperand(null_bda);
	auto not_zero = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpAny);
	not_zero->addIdOperand(compare->getResultId());
	spv::Id cond_id = not_zero->getResultId();
	add_instruction(entry, std::move(compare));
	add_instruction(entry, std::move(not_zero));
	builder.setBuildPoint(entry);
	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(cond_id, body_block, merge_block);

	spv::Id loaded_id;
	{
		builder.setBuildPoint(body_block);
		spv::Id uint_ptr_type = builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type);
		auto bitcast_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_ptr_type, spv::OpBitcast);
		bitcast_op->addIdOperand(func->getParamId(0));
		auto atomic_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpAtomicIAdd);
		atomic_op->addIdOperand(bitcast_op->getResultId());
		atomic_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		atomic_op->addIdOperand(builder.makeUintConstant(0));
		atomic_op->addIdOperand(func->getParamId(1));
		auto add_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uint_type, spv::OpIAdd);
		add_op->addIdOperand(atomic_op->getResultId());
		add_op->addIdOperand(func->getParamId(2));
		loaded_id = add_op->getResultId();
		add_instruction(body_block, std::move(bitcast_op));
		add_instruction(body_block, std::move(atomic_op));
		add_instruction(body_block, std::move(add_op));
		builder.createBranch(merge_block);
	}

	builder.setBuildPoint(merge_block);
	auto phi_op = std::make_unique<spv::Instruction>(
	    builder.getUniqueId(), uint_type, spv::OpPhi);
	phi_op->addIdOperand(builder.makeUintConstant(0));
	phi_op->addIdOperand(entry->getId());
	phi_op->addIdOperand(loaded_id);
	phi_op->addIdOperand(body_block->getId());
	spv::Id return_value = phi_op->getResultId();
	add_instruction(merge_block, std::move(phi_op));
	builder.makeReturn(false, return_value);

	builder.setBuildPoint(current_build_point);
	robust_atomic_counter_call_id = func->getId();
	return func->getId();
}